

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O3

bool libwebm::vttdemux::WriteCueIdentifier(FILE *f,FrameParser *parser)

{
  int iVar1;
  bool bVar2;
  string line;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  iVar1 = libwebvtt::LineReader::GetLine(&parser->super_LineReader,&local_30);
  if (iVar1 == 0) {
    if (local_30._M_string_length == 0) {
LAB_0010d06a:
      bVar2 = true;
      goto LAB_0010d06c;
    }
    iVar1 = fputs(local_30._M_dataplus._M_p,(FILE *)f);
    if (-1 < iVar1) {
      iVar1 = fputc(10,(FILE *)f);
      if (-1 < iVar1) goto LAB_0010d06a;
    }
  }
  bVar2 = false;
LAB_0010d06c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool vttdemux::WriteCueIdentifier(FILE* f, FrameParser* parser) {
  string line;
  int e = parser->GetLine(&line);

  if (e)  // error or EOS
    return false;

  // If the cue identifier line is empty, this means that the original
  // WebVTT cue did not have a cue identifier, so we don't bother
  // writing an extra line terminator to the output file (though doing
  // so would be harmless).

  if (!line.empty()) {
    if (fputs(line.c_str(), f) < 0)
      return false;

    if (fputc('\n', f) < 0)
      return false;
  }

  return true;
}